

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.cpp
# Opt level: O0

void __thiscall
TPZDohrPrecond<long_double,_TPZDohrSubstruct<long_double>_>::Read
          (TPZDohrPrecond<long_double,_TPZDohrSubstruct<long_double>_> *this,TPZStream *buf,
          void *context)

{
  TPZSavable *pTVar1;
  TPZDohrMatrix<long_double,TPZDohrSubstruct<long_double>> *in_RDX;
  list<TPZAutoPointer<TPZDohrSubstruct<long_double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<long_double>_>_>_>
  *in_RSI;
  TPZStream *in_RDI;
  TPZDohrMatrix<long_double,_TPZDohrSubstruct<long_double>_> *ptr;
  _func_int **local_38;
  TPZStream *in_stack_ffffffffffffffd8;
  TPZBaseMatrix *in_stack_ffffffffffffffe0;
  TPZDohrMatrix<long_double,TPZDohrSubstruct<long_double>> *__x;
  
  TPZBaseMatrix::Read(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_RDI);
  __x = in_RDX;
  TPZAutoPointer<TPZDohrAssembly<long_double>_>::operator=
            ((TPZAutoPointer<TPZDohrAssembly<long_double>_> *)in_stack_ffffffffffffffd8,
             (TPZAutoPointer<TPZDohrAssembly<long_double>_> *)in_RDI);
  TPZDohrMatrix<long_double,TPZDohrSubstruct<long_double>>::SubStructures_abi_cxx11_(in_RDX);
  std::__cxx11::
  list<TPZAutoPointer<TPZDohrSubstruct<long_double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<long_double>_>_>_>
  ::operator=(in_RSI,(list<TPZAutoPointer<TPZDohrSubstruct<long_double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<long_double>_>_>_>
                      *)__x);
  (*(code *)(in_RSI->
            super__List_base<TPZAutoPointer<TPZDohrSubstruct<long_double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<long_double>_>_>_>
            )._M_impl._M_node.super__List_node_base._M_next[0xf]._M_prev)(in_RSI,in_RDI + 8,1);
  (*(code *)(in_RSI->
            super__List_base<TPZAutoPointer<TPZDohrSubstruct<long_double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<long_double>_>_>_>
            )._M_impl._M_node.super__List_node_base._M_next[0xe]._M_prev)(in_RSI,in_RDI + 9,1);
  pTVar1 = TPZPersistenceManager::GetInstance(in_RDI);
  if (pTVar1 == (TPZSavable *)0x0) {
    local_38 = (_func_int **)0x0;
  }
  else {
    local_38 = (_func_int **)
               __dynamic_cast(pTVar1,&TPZSavable::typeinfo,&TPZStepSolver<long_double>::typeinfo,0);
  }
  in_RDI[7]._vptr_TPZStream = local_38;
  return;
}

Assistant:

void TPZDohrPrecond<TVar, TSubStruct>::Read(TPZStream &buf, void *context )
{
    TPZMatrix<TVar>::Read(buf,context);
    TPZDohrMatrix<TVar,TSubStruct> *ptr = (TPZDohrMatrix<TVar,TSubStruct> *)(context);
    fAssemble = ptr->fAssembly;
    fGlobal = ptr->SubStructures();
    buf.Read(&fNumCoarse);
    buf.Read(&fNumThreads);
    fCoarse = dynamic_cast<TPZStepSolver<TVar> *>(TPZPersistenceManager::GetInstance(&buf));
}